

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O2

ON_ModelComponentReference __thiscall
ONX_Model::LinePatternFromAttributes(ONX_Model *this,ON_3dmObjectAttributes *attributes)

{
  object_linetype_source oVar1;
  ON_ModelComponent *p;
  ON_Layer *this_00;
  ON_3dmObjectAttributes *in_RDX;
  ON_ModelComponentReference OVar2;
  
  ON_ModelComponent::Index(&ON_Linetype::Continuous.super_ON_ModelComponent);
  oVar1 = ON_3dmObjectAttributes::LinetypeSource(in_RDX);
  if ((((oVar1 != linetype_from_parent) && (oVar1 != linetype_from_object)) &&
      (oVar1 == linetype_from_layer)) && (-1 < in_RDX->m_layer_index)) {
    LayerFromIndex((ONX_Model *)&stack0xffffffffffffffd0,(int)attributes);
    p = ON_ModelComponentReference::ModelComponent
                  ((ON_ModelComponentReference *)&stack0xffffffffffffffd0);
    this_00 = ON_Layer::Cast(&p->super_ON_Object);
    ON_ModelComponentReference::~ON_ModelComponentReference
              ((ON_ModelComponentReference *)&stack0xffffffffffffffd0);
    if (this_00 != (ON_Layer *)0x0) {
      ON_Layer::LinetypeIndex(this_00);
    }
  }
  OVar2 = LinePatternFromIndex(this,(int)attributes);
  OVar2.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ON_ModelComponentReference)
         OVar2.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ON_ModelComponentReference ONX_Model::LinePatternFromAttributes(
  const ON_3dmObjectAttributes& attributes
  ) const
{
  int line_pattern_index = ON_Linetype::Continuous.Index();

  switch ( attributes.LinetypeSource() )
  {
  case ON::linetype_from_layer:
    if (attributes.m_layer_index >= 0)
    {
      const ON_Layer* layer = ON_Layer::Cast(LayerFromIndex(attributes.m_layer_index).ModelComponent());
      if ( nullptr != layer )
        line_pattern_index = layer->LinetypeIndex();
    }
    break;
  case ON::linetype_from_object:
    line_pattern_index = attributes.m_linetype_index;
    break;
  case ON::linetype_from_parent:
    line_pattern_index = attributes.m_linetype_index;
    // TODO: if object is an instance definition, get linetype
    //       from instance references.
    break;
  }

  return LinePatternFromIndex(line_pattern_index);
}